

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O1

void __thiscall
wabt::anon_unknown_1::WatWriter::WriteFoldedExprList(WatWriter *this,ExprList *exprs)

{
  WatWriter *expr;
  pointer pEVar1;
  uint uVar2;
  Index result_count;
  Var *in_RAX;
  Func *pFVar3;
  Exception *pEVar4;
  Index IVar5;
  WatWriter *this_00;
  ulong unaff_R15;
  pointer pEVar6;
  vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
  vStack_70;
  WatWriter *pWStack_58;
  WatWriter *pWStack_50;
  ulong uStack_48;
  code *pcStack_40;
  Var *local_38;
  
  expr = (WatWriter *)exprs->first_;
  local_38 = in_RAX;
joined_r0x00f7ca54:
  if (expr == (WatWriter *)0x0) {
    return;
  }
  switch(*(undefined4 *)
          &(expr->label_stack_).
           super__Vector_base<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
           ._M_impl.super__Vector_impl_data._M_finish) {
  case 0:
  case 0xf:
  case 0x15:
  case 0x1a:
  case 0x2b:
  case 0x2f:
    goto switchD_00f7ca79_caseD_0;
  case 1:
  case 5:
  case 6:
  case 0xd:
  case 0x26:
switchD_00f7ca79_caseD_1:
    IVar5 = 2;
    break;
  case 2:
  case 4:
  case 0x22:
  case 0x2c:
    IVar5 = 3;
    break;
  case 3:
  case 0x27:
    IVar5 = 2;
    goto LAB_00f7cc85;
  case 7:
  case 0x16:
  case 0x2e:
    result_count = (Index)((ulong)((long)expr->inline_import_map_[2].
                                         super__Vector_base<const_wabt::Import_*,_std::allocator<const_wabt::Import_*>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)expr->inline_import_map_[2].
                                        super__Vector_base<const_wabt::Import_*,_std::allocator<const_wabt::Import_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish) >> 2);
    IVar5 = 0;
    goto LAB_00f7cc87;
  case 8:
    pcStack_40 = (code *)0xf7cc40;
    IVar5 = GetLabelArity(this,(Var *)&(expr->label_stack_).
                                       super__Vector_base<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    break;
  case 9:
    pcStack_40 = (code *)0xf7cc56;
    result_count = GetLabelArity(this,(Var *)&(expr->label_stack_).
                                              super__Vector_base<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
    IVar5 = result_count + 1;
    goto LAB_00f7cc87;
  case 10:
    pcStack_40 = (code *)0xf7cc6f;
    IVar5 = GetLabelArity(this,(Var *)&(expr->expr_tree_stack_).
                                       super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    IVar5 = IVar5 + 1;
    break;
  case 0xb:
  case 0x20:
    local_38 = (Var *)&(expr->label_stack_).
                       super__Vector_base<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pcStack_40 = (code *)0xf7cb05;
    pFVar3 = Module::GetFunc(this->module_,local_38);
    unaff_R15 = 0;
    IVar5 = 0;
    if (pFVar3 != (Func *)0x0) {
      IVar5 = (Index)((ulong)((long)(pFVar3->decl).sig.param_types.
                                    super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)(pFVar3->decl).sig.param_types.
                                   super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                   _M_impl.super__Vector_impl_data._M_start) >> 2);
    }
    pcStack_40 = (code *)0xf7cb2c;
    pFVar3 = Module::GetFunc(this->module_,local_38);
    if (pFVar3 != (Func *)0x0) {
      unaff_R15 = (ulong)((long)(pFVar3->decl).sig.result_types.
                                super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)(pFVar3->decl).sig.result_types.
                               super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                               super__Vector_impl_data._M_start) >> 2;
    }
    result_count = (Index)unaff_R15;
    goto LAB_00f7cc87;
  case 0xc:
  case 0x21:
    IVar5 = (int)((ulong)((long)expr->inline_import_map_[0].
                                super__Vector_base<const_wabt::Import_*,_std::allocator<const_wabt::Import_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)expr->inline_import_map_[0].
                               super__Vector_base<const_wabt::Import_*,_std::allocator<const_wabt::Import_*>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 2) + 1;
    result_count = (Index)((ulong)((long)expr->inline_import_map_[1].
                                         super__Vector_base<const_wabt::Import_*,_std::allocator<const_wabt::Import_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)expr->inline_import_map_[1].
                                        super__Vector_base<const_wabt::Import_*,_std::allocator<const_wabt::Import_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 2);
    goto LAB_00f7cc87;
  case 0xe:
  case 0x11:
  case 0x12:
  case 0x1c:
  case 0x30:
    IVar5 = 0;
    break;
  case 0x10:
  case 0x23:
  case 0x24:
    IVar5 = 1;
    goto LAB_00f7cc85;
  case 0x13:
  case 0x14:
    result_count = (Index)((ulong)((long)expr->inline_import_map_[2].
                                         super__Vector_base<const_wabt::Import_*,_std::allocator<const_wabt::Import_*>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)expr->inline_import_map_[2].
                                        super__Vector_base<const_wabt::Import_*,_std::allocator<const_wabt::Import_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish) >> 2);
    IVar5 = 1;
    goto LAB_00f7cc87;
  case 0x17:
  case 0x19:
  case 0x1b:
  case 0x28:
  case 0x29:
    IVar5 = 3;
    goto LAB_00f7cc85;
  case 0x18:
  case 0x1d:
  case 0x1e:
  case 0x2a:
    IVar5 = 0;
    goto LAB_00f7cc85;
  case 0x1f:
    IVar5 = (Index)((ulong)((long)(this->current_func_->decl).sig.result_types.
                                  super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->current_func_->decl).sig.result_types.
                                 super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl
                                 .super__Vector_impl_data._M_start) >> 2);
    break;
  case 0x25:
    uVar2 = *(int *)((long)&(expr->label_stack_).
                            super__Vector_base<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
                            ._M_impl.super__Vector_impl_data._M_finish + 4) - 0xd1;
    if (0x12 < uVar2) goto LAB_00f7ccb0;
    if ((0x24933U >> (uVar2 & 0x1f) & 1) == 0) {
      if ((0x49244U >> (uVar2 & 0x1f) & 1) == 0) goto LAB_00f7ccb0;
      goto switchD_00f7ca79_caseD_1;
    }
    goto switchD_00f7ca79_caseD_0;
  case 0x2d:
    pcStack_40 = (code *)0xf7cc21;
    pEVar4 = Module::GetExcept(this->module_,
                               (Var *)&(expr->label_stack_).
                                       super__Vector_base<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (pEVar4 == (Exception *)0x0) {
      IVar5 = 0;
    }
    else {
      IVar5 = (Index)((ulong)((long)(pEVar4->sig).
                                    super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)(pEVar4->sig).
                                   super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                   _M_impl.super__Vector_impl_data._M_start) >> 2);
    }
LAB_00f7cc85:
    result_count = 0;
    goto LAB_00f7cc87;
  default:
    pcStack_40 = (code *)0xf7ccb0;
    _GLOBAL__N_1::WatWriter::WriteFoldedExprList((WatWriter *)expr);
LAB_00f7ccb0:
    pcStack_40 = FlushExprTreeStack;
    this_00 = expr;
    _GLOBAL__N_1::WatWriter::WriteFoldedExprList((WatWriter *)expr);
    vStack_70.
    super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (this_00->expr_tree_stack_).
         super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
         ._M_impl.super__Vector_impl_data._M_start;
    vStack_70.
    super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (this_00->expr_tree_stack_).
         super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    vStack_70.
    super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (this_00->expr_tree_stack_).
         super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this_00->expr_tree_stack_).
    super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (this_00->expr_tree_stack_).
    super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (this_00->expr_tree_stack_).
    super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pEVar1 = (this_00->expr_tree_stack_).
             super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pWStack_58 = expr;
    pWStack_50 = this;
    uStack_48 = unaff_R15;
    pcStack_40 = (code *)&stack0xfffffffffffffff8;
    if (pEVar1 != (pointer)0x0) {
      pEVar6 = (pointer)0x0;
      pcStack_40 = (code *)&stack0xfffffffffffffff8;
      do {
        std::
        vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
        ::~vector(&pEVar6->children);
        pEVar6 = pEVar6 + 1;
      } while (pEVar6 != pEVar1);
      (this_00->expr_tree_stack_).
      super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    }
    FlushExprTreeVector(this_00,&vStack_70);
    std::
    vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
    ::~vector(&vStack_70);
    return;
  }
LAB_00f7cbec:
  result_count = 1;
LAB_00f7cc87:
  pcStack_40 = (code *)0xf7cc8c;
  PushExpr(this,(Expr *)expr,IVar5,result_count);
  expr = (WatWriter *)((intrusive_list_base<wabt::Expr> *)&expr->module_)->next_;
  goto joined_r0x00f7ca54;
switchD_00f7ca79_caseD_0:
  IVar5 = 1;
  goto LAB_00f7cbec;
}

Assistant:

void WatWriter::WriteFoldedExprList(const ExprList& exprs) {
  WABT_TRACE(WriteFoldedExprList);
  for (const Expr& expr : exprs) {
    WriteFoldedExpr(&expr);
  }
}